

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::checkfac4encroach
          (tetgenmesh *this,point pa,point pb,point pc,point checkpt,double *cent,double *r)

{
  int iVar1;
  undefined1 auVar2 [16];
  point pc_00;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double rd;
  point local_a8;
  double dStack_a0;
  undefined1 local_98 [16];
  double local_88;
  point local_80;
  double prjpt [3];
  double n [3];
  
  local_80 = pc;
  circumsphere(this,pa,pb,pc,(double *)0x0,cent,&rd);
  if ((rd == 0.0) && (!NAN(rd))) {
    terminatetetgen(this,2);
  }
  dVar4 = distance(this,cent,checkpt);
  pc_00 = local_80;
  uVar3 = -(ulong)(ABS(dVar4 - rd) / rd < this->b->epsilon);
  if ((double)(uVar3 & (ulong)rd | ~uVar3 & (ulong)dVar4) < rd) {
    if (this->b->metric == 0) {
      *r = rd;
      return 1;
    }
    iVar1 = this->pointmtrindex;
    if (pa[iVar1] <= 0.0) {
      return 1;
    }
    if (pb[iVar1] <= 0.0) {
      return 1;
    }
    if (local_80[iVar1] <= 0.0) {
      return 1;
    }
    projpt2face(this,checkpt,pa,pb,local_80,prjpt);
    facenormal(this,pa,pb,pc_00,n,1,(double *)0x0);
    local_88 = SQRT(n[2] * n[2] + n[0] * n[0] + n[1] * n[1]);
    facenormal(this,pa,pb,prjpt,n,1,(double *)0x0);
    dVar4 = n[1];
    local_a8 = (point)n[0];
    dStack_a0 = n[1];
    local_98._8_8_ = 0;
    local_98._0_8_ = n[2];
    facenormal(this,pb,pc_00,prjpt,n,1,(double *)0x0);
    auVar5._0_8_ = (double)local_a8 * (double)local_a8 + dVar4 * dVar4;
    auVar5._8_8_ = n[0] * n[0] + n[1] * n[1];
    auVar2._8_8_ = n[2] * n[2] + auVar5._8_8_;
    auVar2._0_8_ = (double)local_98._0_8_ * (double)local_98._0_8_ + auVar5._0_8_;
    local_98 = sqrtpd(auVar5,auVar2);
    local_a8 = pa;
    facenormal(this,pc_00,pa,prjpt,n,1,(double *)0x0);
    dVar4 = SQRT(n[2] * n[2] + n[0] * n[0] + n[1] * n[1]);
    if (ABS(((double)local_98._0_8_ + (double)local_98._8_8_ + dVar4) - local_88) / local_88 <
        this->b->epsilon) {
      iVar1 = this->pointmtrindex;
      rd = (dVar4 / local_88) * pb[iVar1] +
           ((double)local_98._0_8_ / local_88) * pc_00[iVar1] +
           ((double)local_98._8_8_ / local_88) * local_a8[iVar1];
      dVar4 = distance(this,prjpt,checkpt);
      if (dVar4 < rd) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::checkfac4encroach(point pa, point pb, point pc, point checkpt,
                                  REAL* cent, REAL* r)
{
  REAL rd, len;

  circumsphere(pa, pb, pc, NULL, cent, &rd);
  if (rd == 0) {
    terminatetetgen(this, 2);
  }
  len = distance(cent, checkpt);
  if ((fabs(len - rd) / rd) < b->epsilon) len = rd; // Rounding.
 
  if (len < rd) {
    // The point lies inside the circumsphere of this face.
    if (b->metric) { // -m option.
      if ((pa[pointmtrindex] > 0) && (pb[pointmtrindex] > 0) &&
          (pc[pointmtrindex] > 0)) {
        // Get the projection of 'checkpt' in the plane of pa, pb, and pc.
        REAL prjpt[3], n[3];
        REAL a, a1, a2, a3;
        projpt2face(checkpt, pa, pb, pc, prjpt);
        // Get the face area of [a,b,c].
        facenormal(pa, pb, pc, n, 1, NULL);
        a = sqrt(dot(n,n));
        // Get the face areas of [a,b,p], [b,c,p], and [c,a,p].
        facenormal(pa, pb, prjpt, n, 1, NULL);
        a1 = sqrt(dot(n,n));
        facenormal(pb, pc, prjpt, n, 1, NULL);
        a2 = sqrt(dot(n,n));
        facenormal(pc, pa, prjpt, n, 1, NULL);
        a3 = sqrt(dot(n,n));
        if ((fabs(a1 + a2 + a3 - a) / a) < b->epsilon) {
          // This face contains the projection.
          // Get the mesh size at the location of the projection point.
          rd = a1 / a * pc[pointmtrindex]
             + a2 / a * pa[pointmtrindex]
             + a3 / a * pb[pointmtrindex];
          len = distance(prjpt, checkpt);
          if (len < rd) {
            return 1; // Encroached.
          }
        }
      } else {
        return 1;  // No protecting ball. Encroached.
      }
    } else {
      *r = rd;
      return 1;  // Encroached.
    }
  }

  return 0;
}